

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipointcounter_test.cpp
# Opt level: O3

Utest * __thiscall
TEST_MinipointCounterTest_OwnWindPair_TestShell::createTest
          (TEST_MinipointCounterTest_OwnWindPair_TestShell *this)

{
  TEST_MinipointCounterTest_OwnWindPair_Test *this_00;
  
  this_00 = (TEST_MinipointCounterTest_OwnWindPair_Test *)
            operator_new(0xc0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/minipointcounter_test.cpp"
                         ,0xcc);
  TEST_MinipointCounterTest_OwnWindPair_Test::TEST_MinipointCounterTest_OwnWindPair_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MinipointCounterTest, OwnWindPair)
{
	s.setRoundWind(Tile::EastWind);
	s.setSeatWind(Tile::SouthWind);

	addPair(Tile::SouthWind);
	addOpenNoPointsHandWithoutPair();
	s.winByDiscard();

	CHECK_EQUAL(22, m.total(false));
}